

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedFieldInfo.cpp
# Opt level: O2

void FixedFieldInfo::PopulateFixedField(Type *type,Var var,FixedFieldInfo *fixed)

{
  FunctionInfo *pFVar1;
  bool bVar2;
  TSize TVar3;
  JavascriptFunction *obj;
  ScriptFunction *pSVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(fixed->m_data).fieldValue,var);
  (fixed->m_data).nextHasSameFixedField = '\0';
  if (var != (Var)0x0) {
    bVar2 = Js::VarIs<Js::JavascriptFunction>(var);
    if (bVar2) {
      obj = Js::VarTo<Js::JavascriptFunction>(var);
      local_2a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObject((RecyclableObject *)obj);
      TVar3 = ValueType::GetRawData((ValueType *)&local_2a.field_0);
      (fixed->m_data).valueType = TVar3;
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                (&(fixed->m_data).funcInfoAddr,(obj->functionInfo).ptr);
      pFVar1 = (obj->functionInfo).ptr;
      (fixed->m_data).isClassCtor = (byte)(pFVar1->attributes >> 10) & 1;
      (fixed->m_data).localFuncId = pFVar1->functionId;
      bVar2 = Js::VarIs<Js::ScriptFunction>(var);
      if (bVar2) {
        pSVar4 = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  (&(fixed->m_data).environmentAddr,(pSVar4->environment).ptr);
      }
    }
  }
  if (type != (Type *)0x0) {
    JITType::BuildFromJsType(type,(JITType *)&(fixed->m_data).type);
  }
  return;
}

Assistant:

void
FixedFieldInfo::PopulateFixedField(_In_opt_ Js::Type * type, _In_opt_ Js::Var var, _Out_ FixedFieldInfo * fixed)
{
    FixedFieldIDL * rawFF = fixed->GetRaw();
    rawFF->fieldValue = var;
    rawFF->nextHasSameFixedField = false;
    if (var != nullptr && Js::VarIs<Js::JavascriptFunction>(var))
    {
        Js::JavascriptFunction * funcObj = Js::VarTo<Js::JavascriptFunction>(var);
        rawFF->valueType = ValueType::FromObject(funcObj).GetRawData();
        rawFF->funcInfoAddr = (void*)funcObj->GetFunctionInfo();
        rawFF->isClassCtor = funcObj->GetFunctionInfo()->IsClassConstructor();
        rawFF->localFuncId = funcObj->GetFunctionInfo()->GetLocalFunctionId();
        if (Js::VarIs<Js::ScriptFunction>(var))
        {
            rawFF->environmentAddr = (void*)Js::VarTo<Js::ScriptFunction>(funcObj)->GetEnvironment();
        }
    }
    if (type != nullptr)
    {
        JITType::BuildFromJsType(type, (JITType*)&rawFF->type);
    }
}